

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O0

void proto2_unittest::TestAny::SharedDtor(MessageLite *self)

{
  Any *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestAny *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestAny *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 3));
    this = (Any *)local_18[3]._internal_metadata_.ptr_;
    if (this != (Any *)0x0) {
      google::protobuf::Any::~Any(this);
      operator_delete(this,0x28);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/any_test.pb.cc"
             ,0xc6,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestAny::SharedDtor(MessageLite& self) {
  TestAny& this_ = static_cast<TestAny&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.text_.Destroy();
  delete this_._impl_.any_value_;
  this_._impl_.~Impl_();
}